

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O2

void anon_unknown.dwarf_1b803::storeLevel
               (TiledOutputPart *out,ChannelList *channels,int lx,int ly,Image *image)

{
  int iVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  ImageChannel *pIVar5;
  int iVar6;
  int x;
  int y;
  int iVar7;
  FrameBuffer fb;
  allocator<char> local_c9;
  Image *local_c8;
  ChannelList *local_c0;
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  local_b8;
  string local_88;
  undefined1 local_68 [56];
  
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8 = image;
  local_c0 = channels;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
  while( true ) {
    p_Var4 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
    if (p_Var3 == p_Var4) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,(char *)(p_Var3 + 1),&local_c9);
    pIVar5 = Image::channel(local_c8,&local_88);
    (*pIVar5->_vptr_ImageChannel[2])(local_68,pIVar5);
    Imf_3_4::FrameBuffer::insert((char *)&local_b8,(Slice *)(p_Var3 + 1));
    std::__cxx11::string::~string((string *)&local_88);
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  }
  Imf_3_4::TiledOutputPart::setFrameBuffer((FrameBuffer *)out);
  iVar7 = 0;
  while( true ) {
    iVar6 = (int)out;
    iVar1 = Imf_3_4::TiledOutputPart::numYTiles(iVar6);
    if (iVar1 <= iVar7) break;
    iVar1 = 0;
    while( true ) {
      iVar2 = Imf_3_4::TiledOutputPart::numXTiles(iVar6);
      if (iVar2 <= iVar1) break;
      Imf_3_4::TiledOutputPart::writeTile(iVar6,iVar1,iVar7,lx);
      iVar1 = iVar1 + 1;
    }
    iVar7 = iVar7 + 1;
  }
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree(&local_b8);
  return;
}

Assistant:

void
storeLevel (
    TiledOutputPart&   out,
    const ChannelList& channels,
    int                lx,
    int                ly,
    const Image&       image)
{
    //
    // Store the pixels for level (lx, ly) in output file out.
    //

    FrameBuffer fb;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        const char* name = i.name ();
        fb.insert (name, image.channel (name).slice ());
    }

    out.setFrameBuffer (fb);

    for (int y = 0; y < out.numYTiles (ly); ++y)
        for (int x = 0; x < out.numXTiles (lx); ++x)
            out.writeTile (x, y, lx, ly);
}